

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

uint32_t __thiscall
Handler::CalculateMigrateValue
          (Handler *this,PurchasedServer *purchasedServer,VirtualMachine *vm,LOCATION *location)

{
  uint16_t energyCost_00;
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  reference pvVar4;
  LOCATION *in_RCX;
  VirtualMachine *in_RDX;
  PurchasedServer *in_RSI;
  Handler *in_RDI;
  uint16_t remainMemorySizeB_1;
  uint16_t remainCpuCoreB_1;
  uint16_t remainMemorySizeA_1;
  uint16_t remainCpuCoreA_1;
  uint16_t remainMemorySizeB;
  uint16_t remainCpuCoreB;
  uint16_t remainMemorySizeA;
  uint16_t remainCpuCoreA;
  uint16_t halfMemorySize;
  uint16_t halfCpuCore;
  uint16_t memorySize;
  uint16_t cpuCore;
  uint16_t energyCost;
  uint32_t local_4;
  
  pvVar4 = std::vector<Server,_std::allocator<Server>_>::operator[]
                     (&in_RDI->servers,(ulong)in_RSI->serverIdx);
  energyCost_00 = pvVar4->energyCost;
  uVar1 = in_RDX->cpuCore;
  uVar2 = in_RDX->memorySize;
  if ((*in_RCX == ALL) && (bVar3 = CheckCapacity(in_RSI,in_RDX,in_RCX), bVar3)) {
    local_4 = CalculateMigrateValue
                        (in_RDI,in_RSI->remainCpuCoreA + (short)((int)(uint)uVar1 >> 1) * -2 +
                                in_RSI->remainCpuCoreB,
                         in_RSI->remainMemorySizeA + (short)((int)(uint)uVar2 >> 1) * -2 +
                         in_RSI->remainMemorySizeB,energyCost_00);
  }
  else if ((*in_RCX == NODE_A) && (bVar3 = CheckCapacity(in_RSI,in_RDX,in_RCX), bVar3)) {
    local_4 = CalculateMigrateValue
                        (in_RDI,in_RSI->remainCpuCoreA - uVar1,in_RSI->remainMemorySizeA - uVar2,
                         energyCost_00);
  }
  else if ((*in_RCX == NODE_B) && (bVar3 = CheckCapacity(in_RSI,in_RDX,in_RCX), bVar3)) {
    local_4 = CalculateMigrateValue
                        (in_RDI,in_RSI->remainCpuCoreB - uVar1,in_RSI->remainMemorySizeB - uVar2,
                         energyCost_00);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t Handler::CalculateMigrateValue(const PurchasedServer &purchasedServer, const VirtualMachine &vm, const LOCATION &location) {
    uint16_t energyCost = servers[purchasedServer.serverIdx].energyCost;
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (location == ALL && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t halfCpuCore = cpuCore >> 1u;
        uint16_t halfMemorySize = memorySize >> 1u;
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - halfCpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - halfMemorySize;
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - halfCpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - halfMemorySize;
        return CalculateMigrateValue(remainCpuCoreA + remainCpuCoreB, remainMemorySizeA + remainMemorySizeB, energyCost);
    }

    if (location == NODE_A && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - cpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - memorySize;
        return CalculateMigrateValue(remainCpuCoreA, remainMemorySizeA, energyCost);
    }

    if (location == NODE_B && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - cpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - memorySize;
        return CalculateMigrateValue(remainCpuCoreB, remainMemorySizeB, energyCost);
    }

    return 0u;
}